

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O2

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::NewPFor
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  allocator_type local_24;
  allocator_type local_23;
  allocator_type local_22;
  allocator_type local_21;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001bb310;
  (this->ecoder).super_IntegerCODEC._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001bb1b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->exceptionsPositions,0x80,&local_21);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->exceptionsValues,0x80,&local_22);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->exceptions,0x601,&local_23);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->tobecoded,0x80,&local_24);
  return;
}

Assistant:

NewPFor()
      : ecoder(), exceptionsPositions(BlockSize), exceptionsValues(BlockSize),
        exceptions(4 * BlockSize + TAIL_MERGIN + 1), tobecoded(BlockSize) {}